

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HullFinder.cpp
# Opt level: O2

void __thiscall OpenMD::HullFinder::~HullFinder(HullFinder *this)

{
  std::_Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>::~_Vector_base
            (&(this->localSites_).
              super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&(this->nObjects_).super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>::~_Vector_base
            (&(this->molecules_).
              super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>);
  std::_Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>::~_Vector_base
            (&(this->inversions_).
              super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>);
  std::_Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>::~_Vector_base
            (&(this->torsions_).
              super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>);
  std::_Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>::~_Vector_base
            (&(this->bends_).super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>);
  std::_Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>::~_Vector_base
            (&(this->bonds_).super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>);
  std::_Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>::~_Vector_base
            (&(this->stuntdoubles_).
              super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>);
  return;
}

Assistant:

HullFinder::~HullFinder() {
#ifdef HAVE_QHULL
    delete surfaceMesh_;
#endif
  }